

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcConstVal::demote_float(CTcConstVal *this)

{
  int32_t iVar1;
  int ov;
  vbignum_t b;
  int local_1c;
  vbignum_t local_18;
  
  if ((this->typ_ == TC_CVT_FLOAT) && ((this->field_0x20 & 2) != 0)) {
    vbignum_t::vbignum_t(&local_18,(this->val_).floatval_.txt_,(this->val_).floatval_.len_,0);
    iVar1 = CVmObjBigNum::ext_to_int(local_18.ext_,&local_1c);
    if (local_1c == 0) {
      this->typ_ = TC_CVT_INT;
      *(long *)&this->val_ = (long)iVar1;
    }
    vbignum_t::~vbignum_t(&local_18);
  }
  return;
}

Assistant:

void CTcConstVal::demote_float()
{
    /* if this is a promoted integer, see if we can demote it back to int */
    if (typ_ == TC_CVT_FLOAT && promoted_)
    {
        /* get the BigNumber value */
        vbignum_t b(val_.floatval_.txt_, val_.floatval_.len_, 0);

        /* convert it to an integer */
        int ov;
        int32_t i = b.to_int(ov);

        /* if it didn't overflow, demote the constant back to an int */
        if (!ov)
            set_int(i);
    }
}